

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O0

void __thiscall
RenX::BanDatabase::add
          (BanDatabase *this,string *name,uint32_t ip,uint8_t prefix_length,uint64_t steamid,
          string *hwid,string *rdns,string *banner,string *reason,seconds length,uint16_t flags)

{
  pointer pEVar1;
  rep rVar2;
  reference this_00;
  ulong uVar3;
  size_t __n;
  void *__buf;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> local_40;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> entry;
  string *hwid_local;
  uint64_t steamid_local;
  uint8_t prefix_length_local;
  uint32_t ip_local;
  string *name_local;
  BanDatabase *this_local;
  seconds length_local;
  
  entry._M_t.
  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>.
  _M_t.
  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>,_true,_true>
        )(__uniq_ptr_data<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>,_true,_true>
          )hwid;
  std::make_unique<RenX::BanDatabase::Entry>();
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  Entry::set_active(pEVar1);
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  pEVar1->flags = (ushort)*(undefined4 *)&pEVar1->flags | flags;
  rVar2 = std::chrono::_V2::system_clock::now();
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  (pEVar1->timestamp).__d.__r = rVar2;
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  (pEVar1->length).__r = length.__r;
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  pEVar1->steamid = steamid;
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  uVar3 = (ulong)ip;
  pEVar1->ip = ip;
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  __n = CONCAT71((int7)(uVar3 >> 8),prefix_length);
  pEVar1->prefix_length = prefix_length;
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar1->hwid,hwid);
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar1->rdns,rdns);
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar1->name,name);
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar1->banner,banner);
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::operator->(&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar1->reason,reason);
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  ::push_back(&this->m_entries,&local_40);
  this_00 = std::
            vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
            ::back(&this->m_entries);
  pEVar1 = std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
           ::get(this_00);
  write(this,(int)pEVar1,__buf,__n);
  std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
  ~unique_ptr(&local_40);
  return;
}

Assistant:

void RenX::BanDatabase::add(std::string name, uint32_t ip, uint8_t prefix_length, uint64_t steamid, std::string hwid, std::string rdns, std::string banner, std::string reason, std::chrono::seconds length, uint16_t flags) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->set_active();
	entry->flags |= flags;
	entry->timestamp = std::chrono::system_clock::now();
	entry->length = length;
	entry->steamid = steamid;
	entry->ip = ip;
	entry->prefix_length = prefix_length;
	entry->hwid = std::move(hwid);
	entry->rdns = std::move(rdns);
	entry->name = std::move(name);
	entry->banner = std::move(banner);
	entry->reason = std::move(reason);

	m_entries.push_back(std::move(entry));
	write(m_entries.back().get());
}